

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_StringUtilities.cpp
# Opt level: O0

string * __thiscall
soul::getReadableDescriptionOfByteSize_abi_cxx11_
          (string *__return_storage_ptr__,soul *this,uint64_t bytes)

{
  int maxDecimalPlaces;
  undefined4 uVar1;
  undefined4 uVar5;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  allocator<char> local_19;
  soul *local_18;
  uint64_t bytes_local;
  
  local_18 = this;
  bytes_local = (uint64_t)__return_storage_ptr__;
  if (this == (soul *)0x1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"1 byte",&local_19);
    std::allocator<char>::~allocator(&local_19);
  }
  else if (this < (soul *)0x400) {
    std::__cxx11::to_string(&local_50,(unsigned_long)this);
    std::operator+(__return_storage_ptr__,&local_50," bytes");
    std::__cxx11::string::~string((string *)&local_50);
  }
  else {
    maxDecimalPlaces = (int)bytes;
    uVar1 = SUB84(this,0);
    uVar5 = (undefined4)((ulong)this >> 0x20);
    if (this < (soul *)0x100000) {
      auVar2._8_4_ = uVar5;
      auVar2._0_8_ = this;
      auVar2._12_4_ = 0x45300000;
      choc::text::floatToString_abi_cxx11_
                (&local_70,(text *)0x1,
                 ((auVar2._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,uVar1) - 4503599627370496.0)) * 0.0009765625,
                 maxDecimalPlaces);
      std::operator+(__return_storage_ptr__,&local_70," KB");
      std::__cxx11::string::~string((string *)&local_70);
    }
    else if (this < (soul *)0x40000000) {
      auVar3._8_4_ = uVar5;
      auVar3._0_8_ = this;
      auVar3._12_4_ = 0x45300000;
      choc::text::floatToString_abi_cxx11_
                (&local_90,(text *)0x1,
                 ((auVar3._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,uVar1) - 4503599627370496.0)) * 9.5367431640625e-07,
                 maxDecimalPlaces);
      std::operator+(__return_storage_ptr__,&local_90," MB");
      std::__cxx11::string::~string((string *)&local_90);
    }
    else {
      auVar4._8_4_ = uVar5;
      auVar4._0_8_ = this;
      auVar4._12_4_ = 0x45300000;
      choc::text::floatToString_abi_cxx11_
                (&local_b0,(text *)0x1,
                 ((auVar4._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,uVar1) - 4503599627370496.0)) * 9.313225746154785e-10,
                 maxDecimalPlaces);
      std::operator+(__return_storage_ptr__,&local_b0," GB");
      std::__cxx11::string::~string((string *)&local_b0);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string getReadableDescriptionOfByteSize (uint64_t bytes)
{
    if (bytes == 1)                  return "1 byte";
    if (bytes < 1024)                return std::to_string (bytes) + " bytes";
    if (bytes < 1024 * 1024)         return choc::text::floatToString (double (bytes) / 1024.0, 1)                     + " KB";
    if (bytes < 1024 * 1024 * 1024)  return choc::text::floatToString (double (bytes) / (1024.0 * 1024.0), 1)          + " MB";
    else                             return choc::text::floatToString (double (bytes) / (1024.0 * 1024.0 * 1024.0), 1) + " GB";
}